

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_compress.c
# Opt level: O0

size_t ZSTD_CCtx_loadDictionary_advanced
                 (ZSTD_CCtx *cctx,void *dict,size_t dictSize,ZSTD_dictLoadMethod_e dictLoadMethod,
                 ZSTD_dictContentType_e dictContentType)

{
  void *__dest;
  void *dictBuffer;
  ZSTD_dictContentType_e dictContentType_local;
  ZSTD_dictLoadMethod_e dictLoadMethod_local;
  size_t dictSize_local;
  void *dict_local;
  ZSTD_CCtx *cctx_local;
  
  if (cctx->streamStage == zcss_init) {
    ZSTD_clearAllDicts(cctx);
    if ((dict == (void *)0x0) || (dictSize == 0)) {
      cctx_local = (ZSTD_CCtx *)0x0;
    }
    else {
      if (dictLoadMethod == ZSTD_dlm_byRef) {
        (cctx->localDict).dict = dict;
      }
      else {
        if (cctx->staticSize != 0) {
          return 0xffffffffffffffc0;
        }
        __dest = ZSTD_customMalloc(dictSize,cctx->customMem);
        if (__dest == (void *)0x0) {
          return 0xffffffffffffffc0;
        }
        memcpy(__dest,dict,dictSize);
        (cctx->localDict).dictBuffer = __dest;
        (cctx->localDict).dict = __dest;
      }
      (cctx->localDict).dictSize = dictSize;
      (cctx->localDict).dictContentType = dictContentType;
      cctx_local = (ZSTD_CCtx *)0x0;
    }
  }
  else {
    cctx_local = (ZSTD_CCtx *)0xffffffffffffffc4;
  }
  return (size_t)cctx_local;
}

Assistant:

size_t ZSTD_CCtx_loadDictionary_advanced(
        ZSTD_CCtx* cctx,
        const void* dict, size_t dictSize,
        ZSTD_dictLoadMethod_e dictLoadMethod,
        ZSTD_dictContentType_e dictContentType)
{
    DEBUGLOG(4, "ZSTD_CCtx_loadDictionary_advanced (size: %u)", (U32)dictSize);
    RETURN_ERROR_IF(cctx->streamStage != zcss_init, stage_wrong,
                    "Can't load a dictionary when cctx is not in init stage.");
    ZSTD_clearAllDicts(cctx);  /* erase any previously set dictionary */
    if (dict == NULL || dictSize == 0)  /* no dictionary */
        return 0;
    if (dictLoadMethod == ZSTD_dlm_byRef) {
        cctx->localDict.dict = dict;
    } else {
        /* copy dictionary content inside CCtx to own its lifetime */
        void* dictBuffer;
        RETURN_ERROR_IF(cctx->staticSize, memory_allocation,
                        "static CCtx can't allocate for an internal copy of dictionary");
        dictBuffer = ZSTD_customMalloc(dictSize, cctx->customMem);
        RETURN_ERROR_IF(dictBuffer==NULL, memory_allocation,
                        "allocation failed for dictionary content");
        ZSTD_memcpy(dictBuffer, dict, dictSize);
        cctx->localDict.dictBuffer = dictBuffer;  /* owned ptr to free */
        cctx->localDict.dict = dictBuffer;        /* read-only reference */
    }
    cctx->localDict.dictSize = dictSize;
    cctx->localDict.dictContentType = dictContentType;
    return 0;
}